

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fibonacci.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  size_t __n;
  void *__buf;
  int __fd;
  string_view file_name;
  string_view func_name;
  allocator<char> local_a9;
  ProfilerTimer profile_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ScopedTimer JEB_ScopedTimer_36;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:36: "
             ,&local_a9);
  std::operator+(&local_68,&local_88,"int main()");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&profile_40,
                 &local_68,":\n\telapsed time = ");
  if (_ZN8JEBDebugL6STREAME_0 == (Stream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (Stream *)&std::clog;
  }
  JEBDebug::
  ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ScopedTimerImpl(&JEB_ScopedTimer_36,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&profile_40
                    ,_ZN8JEBDebugL6STREAME_0);
  std::__cxx11::string::~string((string *)&profile_40);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  __n = 4;
  file_name._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp"
  ;
  file_name._M_len = 0x6b;
  func_name._M_str = "main";
  func_name._M_len = 4;
  JEBDebug::Profiler::start_timer
            ((Profiler *)JEBDebug::Profiler::instance_,file_name,func_name,0x28);
  if (_ZN8JEBDebugL6STREAME_0 == (Stream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (Stream *)&std::clog;
  }
  poVar1 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:41: "
                          );
  poVar1 = std::operator<<(poVar1,"int main()");
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,"\n\tn = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x1b);
  poVar1 = std::operator<<(poVar1,"\n\tfibonacci_rec(n) = ");
  fibonacci_rec(0x1b);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tfibonacci_it(n) = ");
  lVar2 = fibonacci_it(0x1b);
  __fd = (int)lVar2;
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  JEBDebug::ProfilerTimer::~ProfilerTimer(&profile_40);
  JEBDebug::Profiler::write((Profiler *)JEBDebug::Profiler::instance_,__fd,__buf,__n);
  JEBDebug::
  ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ScopedTimerImpl(&JEB_ScopedTimer_36);
  return 0;
}

Assistant:

int main()
{
    JEB_TIMEIT();

    {
        const int n = 27;
        JEB_PROFILE();
        JEB_SHOW(n, fibonacci_rec(n), fibonacci_it(n));
    }
    JEB_PROFILER_REPORT();
    return 0;
}